

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

char * duckdb::NumericHelper::FormatUnsigned<unsigned_char>(uchar value,char *ptr)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  undefined7 in_register_00000039;
  
  uVar5 = CONCAT71(in_register_00000039,value) & 0xffffffff;
  uVar2 = (uint)CONCAT71(in_register_00000039,value);
  pcVar4 = ptr;
  if (99 < (byte)uVar5) {
    pcVar4 = ptr + -2;
    uVar2 = NumericCastImpl<unsigned_int,_int,_false>::Convert
                      ((uVar2 + (int)(uVar5 * 0x28f5c29 >> 0x20) * -100) * 2);
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
    ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
    uVar2 = (uint)value * 0x29 >> 0xc;
  }
  if ((byte)uVar2 < 10) {
    cVar1 = NumericCastImpl<char,_int,_false>::Convert(uVar2 | 0x30);
    lVar3 = -1;
  }
  else {
    uVar2 = NumericCastImpl<unsigned_int,_int,_false>::Convert(uVar2 * 2);
    pcVar4[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
    lVar3 = -2;
  }
  pcVar4[lVar3] = cVar1;
  return pcVar4 + lVar3;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}